

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_BL(DisasContext_conflict1 *s,arg_i *a)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 extraout_AL;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_R[0xe],s->thumb | (uint)(s->base).pc_next);
  gen_jmp(s,a->imm + (uint)(s->thumb == 0) * 4 + (int)s->pc_curr + 4);
  return (_Bool)extraout_AL;
}

Assistant:

static bool trans_BL(DisasContext *s, arg_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    gen_jmp(s, read_pc(s) + a->imm);
    return true;
}